

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

bool __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator==
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *o)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar2 = (long)this->_cursor - (long)this->_stack;
  if (lVar2 == (long)o->_cursor - (long)o->_stack) {
    lVar3 = lVar2 / 0x1c + 1;
    lVar2 = 0;
    do {
      lVar3 = lVar3 + -1;
      bVar4 = lVar3 == 0;
      if (bVar4) {
        return bVar4;
      }
      bVar1 = Kernel::operator!=((MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                                 ((this->_stack->term).super_PolyNfSuper._inner.
                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                  .
                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                  ._content + lVar2 + -1),
                                 (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                                 ((o->_stack->term).super_PolyNfSuper._inner.
                                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                                  .
                                  super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
                                  ._content + lVar2 + -1));
      lVar2 = lVar2 + 0x1c;
    } while (!bVar1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }